

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O3

ssize_t mqtt_pack_pubxxx_request
                  (uint8_t *buf,size_t bufsz,MQTTControlPacketType control_type,uint16_t packet_id)

{
  ssize_t sVar1;
  uint16_t integer_htons;
  uint8_t *start;
  mqtt_fixed_header fixed_header;
  mqtt_fixed_header local_24;
  
  if (buf != (uint8_t *)0x0) {
    local_24._4_1_ = (control_type == MQTT_CONTROL_PUBREL) * '\x02';
    local_24.remaining_length = 2;
    local_24.control_type = control_type;
    sVar1 = mqtt_pack_fixed_header(buf,bufsz,&local_24);
    if (0 < sVar1) {
      if (bufsz - sVar1 < 2) {
        sVar1 = 0;
      }
      else {
        *(uint16_t *)(buf + sVar1) = packet_id << 8 | packet_id >> 8;
        sVar1 = sVar1 + 2;
      }
    }
    return sVar1;
  }
  return -0x7fffffff;
}

Assistant:

ssize_t mqtt_pack_pubxxx_request(uint8_t *buf, size_t bufsz, 
                                 enum MQTTControlPacketType control_type,
                                 uint16_t packet_id) 
{
    const uint8_t *const start = buf;
    struct mqtt_fixed_header fixed_header;
    ssize_t rv;
    if (buf == NULL) {
        return MQTT_ERROR_NULLPTR;
    }

    /* pack fixed header */
    fixed_header.control_type = control_type;
    if (control_type == MQTT_CONTROL_PUBREL) {
        fixed_header.control_flags = 0x02;
    } else {
        fixed_header.control_flags = 0;
    }
    fixed_header.remaining_length = 2;
    rv = mqtt_pack_fixed_header(buf, bufsz, &fixed_header);
    if (rv <= 0) {
        return rv;
    }
    buf += rv;
    bufsz -= (size_t)rv;

    if (bufsz < fixed_header.remaining_length) {
        return 0;
    }
    
    buf += __mqtt_pack_uint16(buf, packet_id);

    return buf - start;
}